

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_object.cpp
# Opt level: O0

void init_graphical_object(void)

{
  unsigned_short uVar1;
  Am_Object *pAVar2;
  Am_Constraint *pAVar3;
  Am_Method_Wrapper *pAVar4;
  Am_Slot local_80;
  Am_Slot local_78;
  Am_Slot local_70;
  Am_Slot local_68;
  Am_Slot local_60;
  Am_Slot local_58;
  Am_Slot local_50;
  Am_Slot local_48;
  ushort local_3a;
  unsigned_short demon_mask;
  Am_Demon_Set local_30;
  Am_Demon_Set demons;
  Am_Object_Advanced temp;
  Am_Object local_10;
  
  Am_Object::Create(&local_10,(char *)&Am_Root_Object);
  pAVar2 = Am_Object::Add(&local_10,100,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0x65,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0x66,10,0);
  pAVar2 = Am_Object::Add(pAVar2,0x67,10,0);
  pAVar2 = Am_Object::Add(pAVar2,0x69,true,0);
  pAVar2 = Am_Object::Add(pAVar2,0x85,-1,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&compute_depth);
  pAVar2 = Am_Object::Add(pAVar2,0x86,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&pass_window);
  pAVar2 = Am_Object::Add(pAVar2,0x68,pAVar3,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7d8,0,0);
  pAVar2 = Am_Object::Add(pAVar2,2000,0,0);
  pAVar4 = Am_Draw_Method::operator_cast_to_Am_Method_Wrapper_(&generic_mask);
  pAVar2 = Am_Object::Add(pAVar2,0x7d1,pAVar4,0);
  pAVar2 = Am_Object::Add(pAVar2,0x7d7,0,0);
  pAVar4 = Am_Point_In_Method::operator_cast_to_Am_Method_Wrapper_(&generic_point_in_obj);
  pAVar2 = Am_Object::Add(pAVar2,0x7d9,pAVar4,0);
  pAVar4 = Am_Point_In_Or_Self_Method::operator_cast_to_Am_Method_Wrapper_(&generic_point_in_part);
  pAVar2 = Am_Object::Add(pAVar2,0x7da,pAVar4,0);
  pAVar4 = Am_Point_In_Or_Self_Method::operator_cast_to_Am_Method_Wrapper_(&generic_point_in_leaf);
  pAVar2 = Am_Object::Add(pAVar2,0x7db,pAVar4,0);
  pAVar4 = Am_Translate_Coordinates_Method::operator_cast_to_Am_Method_Wrapper_
                     (&generic_translate_coordinates);
  pAVar2 = Am_Object::Add(pAVar2,0x7dc,pAVar4,0);
  pAVar2 = Am_Object::Add(pAVar2,0xdb,false,0);
  Am_Object::operator=(&Am_Graphical_Object,pAVar2);
  Am_Object::~Am_Object(&local_10);
  Am_Object_Advanced::Am_Object_Advanced
            ((Am_Object_Advanced *)&demons,(Am_Object_Advanced *)&Am_Graphical_Object);
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&stack0xffffffffffffffc8);
  Am_Demon_Set::Copy(&local_30);
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)&stack0xffffffffffffffc8);
  Am_Demon_Set::Set_Object_Demon(&local_30,Am_CREATE_OBJ,graphics_create);
  Am_Demon_Set::Set_Object_Demon(&local_30,Am_COPY_OBJ,graphics_create);
  Am_Demon_Set::Set_Object_Demon(&local_30,Am_DESTROY_OBJ,graphics_destroy);
  Am_Demon_Set::Set_Part_Demon(&local_30,Am_CHANGE_OWNER,graphics_change_owner);
  Am_Demon_Set::Set_Slot_Demon(&local_30,4,graphics_repaint,5);
  Am_Demon_Set::Set_Slot_Demon(&local_30,8,graphics_move,5);
  Am_Demon_Set::Set_Type_Check(&local_30,1,Am_Check_Int_Type);
  uVar1 = Am_Object_Advanced::Get_Demon_Mask((Am_Object_Advanced *)&demons);
  local_3a = uVar1 | 0xc;
  Am_Object_Advanced::Set_Demon_Mask((Am_Object_Advanced *)&demons,local_3a);
  Am_Object_Advanced::Set_Demons((Am_Object_Advanced *)&demons,&local_30);
  local_48 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,100);
  Am_Slot::Set_Demon_Bits(&local_48,9);
  local_50 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,100);
  Am_Slot::Set_Type_Check(&local_50,1);
  local_58 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,0x65);
  Am_Slot::Set_Demon_Bits(&local_58,9);
  local_60 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,0x65);
  Am_Slot::Set_Type_Check(&local_60,1);
  local_68 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,0x66);
  Am_Slot::Set_Demon_Bits(&local_68,9);
  local_70 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,0x67);
  Am_Slot::Set_Demon_Bits(&local_70,9);
  local_78 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,0x69);
  Am_Slot::Set_Demon_Bits(&local_78,9);
  local_80 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,0x7d8);
  Am_Slot::Set_Inherit_Rule(&local_80,Am_LOCAL);
  Am_Demon_Set::~Am_Demon_Set(&local_30);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&demons);
  return;
}

Assistant:

void
init_graphical_object()
{
  Am_Graphical_Object =
      Am_Root_Object.Create(DSTR("Am_Graphical_Object"))
          .Add(Am_LEFT, 0)
          .Add(Am_TOP, 0)
          .Add(Am_WIDTH, 10)
          .Add(Am_HEIGHT, 10)
          .Add(Am_VISIBLE, true)
          .Add(Am_RANK, -1)
          .Add(Am_OWNER_DEPTH, compute_depth)
          .Add(Am_WINDOW, pass_window)
          .Add(Am_PREV_STATE, (0L))
          .Add(Am_DRAW_METHOD, (0L))
          .Add(Am_MASK_METHOD, generic_mask)
          .Add(Am_INVALID_METHOD, (0L))
          .Add(Am_POINT_IN_OBJ_METHOD, generic_point_in_obj)
          .Add(Am_POINT_IN_PART_METHOD, generic_point_in_part)
          .Add(Am_POINT_IN_LEAF_METHOD, generic_point_in_leaf)
          .Add(Am_TRANSLATE_COORDINATES_METHOD, generic_translate_coordinates)
          .Add(Am_AS_LINE, false) //most objects are not like lines
      ;
  Am_Object_Advanced temp = (Am_Object_Advanced &)Am_Graphical_Object;
  Am_Demon_Set demons = temp.Get_Demons().Copy();
  demons.Set_Object_Demon(Am_CREATE_OBJ, graphics_create);
  demons.Set_Object_Demon(Am_COPY_OBJ, graphics_create);
  demons.Set_Object_Demon(Am_DESTROY_OBJ, graphics_destroy);
  demons.Set_Part_Demon(Am_CHANGE_OWNER, graphics_change_owner);
  demons.Set_Slot_Demon(Am_STATIONARY_REDRAW, graphics_repaint,
                        Am_DEMON_PER_OBJECT | Am_DEMON_ON_CHANGE);
  demons.Set_Slot_Demon(Am_MOVING_REDRAW, graphics_move,
                        Am_DEMON_PER_OBJECT | Am_DEMON_ON_CHANGE);
  demons.Set_Type_Check(1, Am_Check_Int_Type);
  unsigned short demon_mask = temp.Get_Demon_Mask();
  demon_mask |= Am_STATIONARY_REDRAW | Am_MOVING_REDRAW;
  temp.Set_Demon_Mask(demon_mask);
  temp.Set_Demons(demons);
  temp.Get_Slot(Am_LEFT).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_LEFT).Set_Type_Check(1);
  temp.Get_Slot(Am_TOP).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_TOP).Set_Type_Check(1);
  temp.Get_Slot(Am_WIDTH).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_HEIGHT).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_VISIBLE).Set_Demon_Bits(Am_MOVING_REDRAW | Am_EAGER_DEMON);
  temp.Get_Slot(Am_PREV_STATE).Set_Inherit_Rule(Am_LOCAL);
#ifdef DEBUG
  Am_Graphical_Object.Add(Am_OBJECT_IN_PROGRESS, 0)
      .Set_Inherit_Rule(Am_OBJECT_IN_PROGRESS, Am_LOCAL);
#endif
}